

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O3

rk_s32 kmpp_obj_test(KmppObj obj,char *name)

{
  MppTrieInfo *pMVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((obj != (KmppObj)0x0) && (*(MppTrie *)((long)obj + 0x10) != (MppTrie)0x0)) {
    pMVar1 = mpp_trie_get_info(*(MppTrie *)((long)obj + 0x10),name);
    if (pMVar1 != (MppTrieInfo *)0x0) {
      uVar2 = (uint)((*(uint *)(*(long *)((long)obj + 0x28) +
                               (ulong)(*(ushort *)(&pMVar1[2].field_0x2 + (byte)pMVar1->field_0x3)
                                      >> 5) * 4) >>
                      (*(ushort *)(&pMVar1[2].field_0x2 + (byte)pMVar1->field_0x3) & 0x1f) & 1) != 0
                    );
    }
  }
  return uVar2;
}

Assistant:

rk_s32 kmpp_obj_test(KmppObj obj, const char *name)
{
    KmppObjImpl *impl = (KmppObjImpl *)obj;

    if (impl && impl->trie) {
        MppTrieInfo *info = mpp_trie_get_info(impl->trie, name);

        if (info) {
            KmppEntry *tbl = (KmppEntry *)mpp_trie_info_ctx(info);

            return ENTRY_TEST_FLAG(tbl, impl->entry);;
        }
    }

    return 0;
}